

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     scas<unsigned_char,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (unsigned_short *eCX,unsigned_short *eDI,uchar *eAX,Context *context)

{
  read_t<unsigned_char> source;
  
  source = (context->memory).memory._M_elems
           [(uint)*eDI + ((context->memory).segments_)->es_base_ & 0xfffff];
  *eDI = (short)(context->flags).direction_ + *eDI;
  sub<false,(InstructionSet::x86::AccessType)0,unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (*eAX,source,context);
  return;
}

Assistant:

void scas(
	AddressT &eCX,
	AddressT &eDI,
	IntT &eAX,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	const IntT rhs = context.memory.template access<IntT, AccessType::Read>(Source::ES, eDI);
	eDI += context.flags.template direction<AddressT>() * sizeof(IntT);

	Primitive::sub<false, AccessType::Read, IntT>(eAX, rhs, context);

	repeat<AddressT, repetition>(eCX, context);
}